

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O0

Ref_Man_t * Dar_ManRefStart(Aig_Man_t *pAig,Dar_RefPar_t *pPars)

{
  int nWords;
  Ref_Man_t *__s;
  Vec_Vec_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  Ref_Man_t *p;
  Dar_RefPar_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  __s = (Ref_Man_t *)malloc(0xa0);
  memset(__s,0,0xa0);
  __s->pAig = pAig;
  __s->pPars = pPars;
  pVVar1 = Vec_VecStart(pPars->nCutsMax);
  __s->vCuts = pVVar1;
  pVVar2 = Vec_PtrAllocTruthTables(pPars->nLeafMax);
  __s->vTruthElem = pVVar2;
  nWords = Kit_TruthWordNum(pPars->nLeafMax);
  pVVar2 = Vec_PtrAllocSimInfo(0x400,nWords);
  __s->vTruthStore = pVVar2;
  pVVar3 = Vec_IntAlloc(0x10000);
  __s->vMemory = pVVar3;
  pVVar2 = Vec_PtrAlloc(0x100);
  __s->vCutNodes = pVVar2;
  pVVar2 = Vec_PtrAlloc(pPars->nLeafMax);
  __s->vLeavesBest = pVVar2;
  (__s->DecPars).nVarsMax = pPars->nLeafMax;
  (__s->DecPars).fVerbose = pPars->fVerbose;
  (__s->DecPars).fVeryVerbose = 0;
  return __s;
}

Assistant:

Ref_Man_t * Dar_ManRefStart( Aig_Man_t * pAig, Dar_RefPar_t * pPars )
{
    Ref_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Ref_Man_t, 1 );
    memset( p, 0, sizeof(Ref_Man_t) );
    p->pAig         = pAig;
    p->pPars        = pPars;
    // other data
    p->vCuts        = Vec_VecStart( pPars->nCutsMax );
    p->vTruthElem   = Vec_PtrAllocTruthTables( pPars->nLeafMax );
    p->vTruthStore  = Vec_PtrAllocSimInfo( 1024, Kit_TruthWordNum(pPars->nLeafMax) );
    p->vMemory      = Vec_IntAlloc( 1 << 16 );
    p->vCutNodes    = Vec_PtrAlloc( 256 );
    p->vLeavesBest  = Vec_PtrAlloc( pPars->nLeafMax );
    // alloc bi-decomposition manager
    p->DecPars.nVarsMax = pPars->nLeafMax;
    p->DecPars.fVerbose = pPars->fVerbose;
    p->DecPars.fVeryVerbose = 0;
//    p->pManDec = Bdc_ManAlloc( &p->DecPars );
    return p;
}